

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_finish(nk_context *ctx,nk_window *win)

{
  long in_RSI;
  nk_context *in_RDI;
  void *memory;
  nk_command *parent_last;
  nk_popup_buffer *buf;
  
  if (((in_RDI != (nk_context *)0x0) && (in_RSI != 0)) &&
     (nk_finish_buffer(in_RDI,(nk_command_buffer *)(in_RSI + 0x68)), *(int *)(in_RSI + 0x150) != 0))
  {
    *(undefined8 *)((long)(in_RDI->memory).memory.ptr + *(long *)(in_RSI + 0x138) + 8) =
         *(undefined8 *)(in_RSI + 0x148);
  }
  return;
}

Assistant:

NK_LIB void
nk_finish(struct nk_context *ctx, struct nk_window *win)
{
struct nk_popup_buffer *buf;
struct nk_command *parent_last;
void *memory;

NK_ASSERT(ctx);
NK_ASSERT(win);
if (!ctx || !win) return;
nk_finish_buffer(ctx, &win->buffer);
if (!win->popup.buf.active) return;

buf = &win->popup.buf;
memory = ctx->memory.memory.ptr;
parent_last = nk_ptr_add(struct nk_command, memory, buf->parent);
parent_last->next = buf->end;
}